

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O1

map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
* kratos::get_state_color
            (map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
             *__return_storage_ptr__,
            vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *states)

{
  _Rb_tree_header *p_Var1;
  pointer ppFVar2;
  FSMState **ppFVar3;
  Color CVar4;
  ulong uVar5;
  mapped_type *__args_1;
  size_t __i;
  long lVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  FSMState **state;
  pointer ppFVar9;
  FSMState **state_1;
  FSMState **__args;
  double dVar10;
  undefined1 local_1400 [8];
  mt19937 gen;
  map<const_kratos::FSM_*,_kratos::color::Color,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
  state_color;
  FSM *local_40;
  FSM *fsm;
  Color color;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  state_color._M_t._M_impl._0_4_ = 0;
  state_color._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  state_color._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  state_color._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_1400 = (undefined1  [8])0x1;
  uVar5 = 1;
  lVar6 = 1;
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar6);
    gen._M_x[lVar6 + -1] = uVar5;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x270);
  gen._M_x[0x26f] = 0x270;
  ppFVar9 = (states->super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  state_color._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)states;
  ppFVar2 = (states->super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  state_color._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&state_color;
  state_color._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&state_color;
  if (ppFVar9 != ppFVar2) {
    do {
      local_40 = (*ppFVar9)->parent_;
      p_Var7 = (_Base_ptr)&state_color;
      for (p_Var8 = (_Base_ptr)state_color._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
          p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[*(FSM **)(p_Var8 + 1) < local_40]) {
        if (*(FSM **)(p_Var8 + 1) >= local_40) {
          p_Var7 = p_Var8;
        }
      }
      p_Var8 = (_Base_ptr)&state_color;
      if ((p_Var7 != (_Base_ptr)&state_color) && (p_Var8 = p_Var7, local_40 < *(FSM **)(p_Var7 + 1))
         ) {
        p_Var8 = (_Base_ptr)&state_color;
      }
      if (p_Var8 == (_Base_ptr)&state_color) {
        dVar10 = std::
                 generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_1400);
        dVar10 = fmod(dVar10 + 0.0 + 0.618033988749895,1.0);
        CVar4 = kratos::color::hsv_to_rgb(dVar10,0.5,0.95);
        fsm._4_2_ = CVar4._0_2_;
        fsm._6_1_ = CVar4.B;
        std::
        _Rb_tree<kratos::FSM_const*,std::pair<kratos::FSM_const*const,kratos::color::Color>,std::_Select1st<std::pair<kratos::FSM_const*const,kratos::color::Color>>,std::less<kratos::FSM_const*>,std::allocator<std::pair<kratos::FSM_const*const,kratos::color::Color>>>
        ::_M_emplace_unique<kratos::FSM_const*&,kratos::color::Color&>
                  ((_Rb_tree<kratos::FSM_const*,std::pair<kratos::FSM_const*const,kratos::color::Color>,std::_Select1st<std::pair<kratos::FSM_const*const,kratos::color::Color>>,std::less<kratos::FSM_const*>,std::allocator<std::pair<kratos::FSM_const*const,kratos::color::Color>>>
                    *)&gen._M_p,&local_40,(Color *)((long)&fsm + 4));
      }
      ppFVar9 = ppFVar9 + 1;
    } while (ppFVar9 != ppFVar2);
  }
  __args = *(FSMState ***)state_color._M_t._M_impl.super__Rb_tree_header._M_node_count;
  ppFVar3 = *(FSMState ***)(state_color._M_t._M_impl.super__Rb_tree_header._M_node_count + 8);
  if (__args != ppFVar3) {
    do {
      local_40 = (*__args)->parent_;
      __args_1 = std::
                 map<const_kratos::FSM_*,_kratos::color::Color,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
                 ::at((map<const_kratos::FSM_*,_kratos::color::Color,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
                       *)&gen._M_p,&local_40);
      std::
      _Rb_tree<kratos::FSMState*,std::pair<kratos::FSMState*const,kratos::color::Color>,std::_Select1st<std::pair<kratos::FSMState*const,kratos::color::Color>>,std::less<kratos::FSMState*>,std::allocator<std::pair<kratos::FSMState*const,kratos::color::Color>>>
      ::_M_emplace_unique<kratos::FSMState*const&,kratos::color::Color&>
                ((_Rb_tree<kratos::FSMState*,std::pair<kratos::FSMState*const,kratos::color::Color>,std::_Select1st<std::pair<kratos::FSMState*const,kratos::color::Color>>,std::less<kratos::FSMState*>,std::allocator<std::pair<kratos::FSMState*const,kratos::color::Color>>>
                  *)__return_storage_ptr__,__args,__args_1);
      __args = __args + 1;
    } while (__args != ppFVar3);
  }
  std::
  _Rb_tree<const_kratos::FSM_*,_std::pair<const_kratos::FSM_*const,_kratos::color::Color>,_std::_Select1st<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
  ::~_Rb_tree((_Rb_tree<const_kratos::FSM_*,_std::pair<const_kratos::FSM_*const,_kratos::color::Color>,_std::_Select1st<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>,_std::less<const_kratos::FSM_*>,_std::allocator<std::pair<const_kratos::FSM_*const,_kratos::color::Color>_>_>
               *)&gen._M_p);
  return __return_storage_ptr__;
}

Assistant:

std::map<FSMState*, color::Color> get_state_color(const std::vector<FSMState*>& states) {
    std::map<FSMState*, color::Color> result = {};
    std::map<const FSM*, color::Color> state_color;
    // set seed to 0
    std::mt19937 gen(1);  // NOLINT
    std::uniform_real_distribution<double> dis(0, 1.0);
    for (auto const& state : states) {
        auto const* fsm = state->parent();
        if (state_color.find(fsm) == state_color.end()) {
            // get a new color
            double h = dis(gen);
            // use golden ratio
            // https://martin.ankerl.com/2009/12/09/how-to-create-random-colors-programmatically/
            h += 0.618033988749895;
            h = std::fmod(h, 1.0);
            auto color = color::hsv_to_rgb(h, 0.5, 0.95);
            state_color.emplace(fsm, color);
        }
    }

    // second pass the assign colors
    for (const auto& state : states) {
        const auto* fsm = state->parent();
        result.emplace(state, state_color.at(fsm));
    }

    return result;
}